

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_c_api_tests.c
# Opt level: O2

void encode_smallExample_isSuccessful(void)

{
  undefined4 in_EAX;
  bech32_error bVar1;
  int iVar2;
  size_t hrplen;
  bech32_bstring *bstring;
  uchar dp [3];
  undefined5 uStack_25;
  char hrp [4];
  
  _dp = CONCAT44(0x7a7978,in_EAX);
  _dp = CONCAT53(uStack_25,0x30000);
  _dp = CONCAT62(stack0xffffffffffffffda,0x201);
  hrplen = strlen(hrp);
  bstring = bech32_create_bstring(hrplen,3);
  bVar1 = bech32_encode(bstring,hrp,dp,3);
  if (bVar1 != E_BECH32_SUCCESS) {
    __assert_fail("bech32_encode(bstring, hrp, dp, sizeof(dp)) == E_BECH32_SUCCESS",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x11b,"void encode_smallExample_isSuccessful(void)");
  }
  iVar2 = strcmp("xyz1pzrs3usye",bstring->string);
  if (iVar2 == 0) {
    bech32_free_bstring(bstring);
    return;
  }
  __assert_fail("strcmp(expected, bstring->string) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                ,0x11c,"void encode_smallExample_isSuccessful(void)");
}

Assistant:

void encode_smallExample_isSuccessful(void) {
    char hrp[] = "xyz";
    unsigned char dp[] = {1,2,3};
    char expected[] = "xyz1pzrs3usye";
    bech32_bstring *bstring = bech32_create_bstring(strlen(hrp), sizeof(dp));

    assert(bech32_encode(bstring, hrp, dp, sizeof(dp)) == E_BECH32_SUCCESS);
    assert(strcmp(expected, bstring->string) == 0);

    bech32_free_bstring(bstring);
}